

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall lexer::Lexer::Lexer(Lexer *this,string *inp)

{
  allocator<char> local_549;
  string local_548;
  Word local_528;
  allocator<char> local_4d1;
  string local_4d0;
  Word local_4b0;
  allocator<char> local_459;
  string local_458;
  Word local_438;
  allocator<char> local_3e1;
  string local_3e0;
  Word local_3c0;
  allocator<char> local_369;
  string local_368;
  Word local_348;
  allocator<char> local_2f1;
  string local_2f0;
  Word local_2d0;
  allocator<char> local_279;
  string local_278;
  Word local_258;
  allocator<char> local_201;
  string local_200;
  Word local_1e0;
  allocator<char> local_189;
  string local_188;
  Word local_168;
  allocator<char> local_111;
  string local_110;
  Word local_f0;
  allocator<char> local_89;
  string local_88;
  Word local_68;
  string *local_18;
  string *inp_local;
  Lexer *this_local;
  
  this->line = 1;
  local_18 = inp;
  inp_local = (string *)this;
  std::__cxx11::string::string((string *)&this->input,inp);
  this->readPosition = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"true",&local_89);
  Word::Word(&local_68,TRUE,&local_88);
  reserve(this,&local_68);
  Word::~Word(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"false",&local_111);
  Word::Word(&local_f0,FALSE,&local_110);
  reserve(this,&local_f0);
  Word::~Word(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"define",&local_189);
  Word::Word(&local_168,DEFINE,&local_188);
  reserve(this,&local_168);
  Word::~Word(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"declare",&local_201);
  Word::Word(&local_1e0,DECLARE,&local_200);
  reserve(this,&local_1e0);
  Word::~Word(&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"init",&local_279);
  Word::Word(&local_258,INIT,&local_278);
  reserve(this,&local_258);
  Word::~Word(&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"if",&local_2f1);
  Word::Word(&local_2d0,IF,&local_2f0);
  reserve(this,&local_2d0);
  Word::~Word(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"else",&local_369);
  Word::Word(&local_348,ELSE,&local_368);
  reserve(this,&local_348);
  Word::~Word(&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"for",&local_3e1);
  Word::Word(&local_3c0,FOR,&local_3e0);
  reserve(this,&local_3c0);
  Word::~Word(&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"return",&local_459);
  Word::Word(&local_438,RETURN,&local_458);
  reserve(this,&local_438);
  Word::~Word(&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"in",&local_4d1);
  Word::Word(&local_4b0,IN,&local_4d0);
  reserve(this,&local_4b0);
  Word::~Word(&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"null",&local_549);
  Word::Word(&local_528,NULLTOKEN,&local_548);
  reserve(this,&local_528);
  Word::~Word(&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  return;
}

Assistant:

explicit Lexer(std::string inp):input{inp},readPosition{0}{
        reserve(Word(TokenType::TRUE, "true"));
        reserve(Word(TokenType::FALSE, "false"));
        reserve(Word(TokenType::DEFINE, "define"));
        reserve(Word(TokenType::DECLARE, "declare"));
        reserve(Word(TokenType::INIT, "init"));
        reserve(Word(TokenType::IF, "if"));
        reserve(Word(TokenType::ELSE, "else"));
        reserve(Word(TokenType::FOR, "for"));
        reserve(Word(TokenType::RETURN, "return"));
        reserve(Word(TokenType::IN, "in"));
        reserve(Word(TokenType::NULLTOKEN, "null"));
    }